

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux-core.c
# Opt level: O0

int read_models(uint numcpus,uv_cpu_info_t *ci)

{
  int iVar1;
  FILE *__stream;
  int *piVar2;
  char *pcVar3;
  size_t sVar4;
  int model_id;
  FILE *fp;
  char *model;
  char buf [1024];
  uint local_28;
  uint part_idx;
  uint speed_idx;
  uint model_idx;
  char *inferred_model;
  uv_cpu_info_t *ci_local;
  uint numcpus_local;
  
  part_idx = 0;
  local_28 = 0;
  __stream = (FILE *)uv__open_file("/proc/cpuinfo");
  if (__stream == (FILE *)0x0) {
    piVar2 = __errno_location();
    ci_local._4_4_ = -*piVar2;
  }
  else {
    while (pcVar3 = fgets((char *)&model,0x400,__stream), pcVar3 != (char *)0x0) {
      if ((part_idx < numcpus) && (iVar1 = strncmp((char *)&model,"model name\t: ",0xd), iVar1 == 0)
         ) {
        sVar4 = strlen(buf + 5);
        pcVar3 = uv__strndup(buf + 5,sVar4 - 1);
        if (pcVar3 == (char *)0x0) {
          fclose(__stream);
          return -0xc;
        }
        ci[part_idx].model = pcVar3;
        part_idx = part_idx + 1;
      }
      else if ((local_28 < numcpus) &&
              (iVar1 = strncmp((char *)&model,"cpu MHz\t\t: ",0xb), iVar1 == 0)) {
        iVar1 = atoi(buf + 3);
        ci[local_28].speed = iVar1;
        local_28 = local_28 + 1;
      }
    }
    fclose(__stream);
    _speed_idx = "unknown";
    if (part_idx != 0) {
      _speed_idx = ci[part_idx - 1].model;
    }
    while (part_idx < numcpus) {
      sVar4 = strlen(_speed_idx);
      pcVar3 = uv__strndup(_speed_idx,sVar4);
      if (pcVar3 == (char *)0x0) {
        return -0xc;
      }
      ci[part_idx].model = pcVar3;
      part_idx = part_idx + 1;
    }
    ci_local._4_4_ = 0;
  }
  return ci_local._4_4_;
}

Assistant:

static int read_models(unsigned int numcpus, uv_cpu_info_t* ci) {
#if defined(__PPC__)
  static const char model_marker[] = "cpu\t\t: ";
  static const char speed_marker[] = "clock\t\t: ";
#else
  static const char model_marker[] = "model name\t: ";
  static const char speed_marker[] = "cpu MHz\t\t: ";
#endif
  const char* inferred_model;
  unsigned int model_idx;
  unsigned int speed_idx;
  unsigned int part_idx;
  char buf[1024];
  char* model;
  FILE* fp;
  int model_id;

  /* Most are unused on non-ARM, non-MIPS and non-x86 architectures. */
  (void) &model_marker;
  (void) &speed_marker;
  (void) &speed_idx;
  (void) &part_idx;
  (void) &model;
  (void) &buf;
  (void) &fp;
  (void) &model_id;

  model_idx = 0;
  speed_idx = 0;
  part_idx = 0;

#if defined(__arm__) || \
    defined(__i386__) || \
    defined(__mips__) || \
    defined(__aarch64__) || \
    defined(__PPC__) || \
    defined(__x86_64__)
  fp = uv__open_file("/proc/cpuinfo");
  if (fp == NULL)
    return UV__ERR(errno);

  while (fgets(buf, sizeof(buf), fp)) {
    if (model_idx < numcpus) {
      if (strncmp(buf, model_marker, sizeof(model_marker) - 1) == 0) {
        model = buf + sizeof(model_marker) - 1;
        model = uv__strndup(model, strlen(model) - 1);  /* Strip newline. */
        if (model == NULL) {
          fclose(fp);
          return UV_ENOMEM;
        }
        ci[model_idx++].model = model;
        continue;
      }
    }
#if defined(__arm__) || defined(__mips__) || defined(__aarch64__)
    if (model_idx < numcpus) {
#if defined(__arm__)
      /* Fallback for pre-3.8 kernels. */
      static const char model_marker[] = "Processor\t: ";
#elif defined(__aarch64__)
      static const char part_marker[] = "CPU part\t: ";

      /* Adapted from: https://github.com/karelzak/util-linux */
      struct vendor_part {
        const int id;
        const char* name;
      };

      static const struct vendor_part arm_chips[] = {
        { 0x811, "ARM810" },
        { 0x920, "ARM920" },
        { 0x922, "ARM922" },
        { 0x926, "ARM926" },
        { 0x940, "ARM940" },
        { 0x946, "ARM946" },
        { 0x966, "ARM966" },
        { 0xa20, "ARM1020" },
        { 0xa22, "ARM1022" },
        { 0xa26, "ARM1026" },
        { 0xb02, "ARM11 MPCore" },
        { 0xb36, "ARM1136" },
        { 0xb56, "ARM1156" },
        { 0xb76, "ARM1176" },
        { 0xc05, "Cortex-A5" },
        { 0xc07, "Cortex-A7" },
        { 0xc08, "Cortex-A8" },
        { 0xc09, "Cortex-A9" },
        { 0xc0d, "Cortex-A17" },  /* Originally A12 */
        { 0xc0f, "Cortex-A15" },
        { 0xc0e, "Cortex-A17" },
        { 0xc14, "Cortex-R4" },
        { 0xc15, "Cortex-R5" },
        { 0xc17, "Cortex-R7" },
        { 0xc18, "Cortex-R8" },
        { 0xc20, "Cortex-M0" },
        { 0xc21, "Cortex-M1" },
        { 0xc23, "Cortex-M3" },
        { 0xc24, "Cortex-M4" },
        { 0xc27, "Cortex-M7" },
        { 0xc60, "Cortex-M0+" },
        { 0xd01, "Cortex-A32" },
        { 0xd03, "Cortex-A53" },
        { 0xd04, "Cortex-A35" },
        { 0xd05, "Cortex-A55" },
        { 0xd06, "Cortex-A65" },
        { 0xd07, "Cortex-A57" },
        { 0xd08, "Cortex-A72" },
        { 0xd09, "Cortex-A73" },
        { 0xd0a, "Cortex-A75" },
        { 0xd0b, "Cortex-A76" },
        { 0xd0c, "Neoverse-N1" },
        { 0xd0d, "Cortex-A77" },
        { 0xd0e, "Cortex-A76AE" },
        { 0xd13, "Cortex-R52" },
        { 0xd20, "Cortex-M23" },
        { 0xd21, "Cortex-M33" },
        { 0xd41, "Cortex-A78" },
        { 0xd42, "Cortex-A78AE" },
        { 0xd4a, "Neoverse-E1" },
        { 0xd4b, "Cortex-A78C" },
      };

      if (strncmp(buf, part_marker, sizeof(part_marker) - 1) == 0) {
        model = buf + sizeof(part_marker) - 1;

        errno = 0;
        model_id = strtol(model, NULL, 16);
        if ((errno != 0) || model_id < 0) {
          fclose(fp);
          return UV_EINVAL;
        }

        for (part_idx = 0; part_idx < ARRAY_SIZE(arm_chips); part_idx++) {
          if (model_id == arm_chips[part_idx].id) {
            model = uv__strdup(arm_chips[part_idx].name);
            if (model == NULL) {
              fclose(fp);
              return UV_ENOMEM;
            }
            ci[model_idx++].model = model;
            break;
          }
        }
      }
#else	/* defined(__mips__) */
      static const char model_marker[] = "cpu model\t\t: ";
#endif
      if (strncmp(buf, model_marker, sizeof(model_marker) - 1) == 0) {
        model = buf + sizeof(model_marker) - 1;
        model = uv__strndup(model, strlen(model) - 1);  /* Strip newline. */
        if (model == NULL) {
          fclose(fp);
          return UV_ENOMEM;
        }
        ci[model_idx++].model = model;
        continue;
      }
    }
#else  /* !__arm__ && !__mips__ && !__aarch64__ */
    if (speed_idx < numcpus) {
      if (strncmp(buf, speed_marker, sizeof(speed_marker) - 1) == 0) {
        ci[speed_idx++].speed = atoi(buf + sizeof(speed_marker) - 1);
        continue;
      }
    }
#endif  /* __arm__ || __mips__ || __aarch64__ */
  }

  fclose(fp);
#endif  /* __arm__ || __i386__ || __mips__ || __PPC__ || __x86_64__ || __aarch__ */

  /* Now we want to make sure that all the models contain *something* because
   * it's not safe to leave them as null. Copy the last entry unless there
   * isn't one, in that case we simply put "unknown" into everything.
   */
  inferred_model = "unknown";
  if (model_idx > 0)
    inferred_model = ci[model_idx - 1].model;

  while (model_idx < numcpus) {
    model = uv__strndup(inferred_model, strlen(inferred_model));
    if (model == NULL)
      return UV_ENOMEM;
    ci[model_idx++].model = model;
  }

  return 0;
}